

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::IsPopupOpen(ImGuiID id,ImGuiPopupFlags popup_flags)

{
  ImGuiContext *pIVar1;
  ImGuiPopupData *pIVar2;
  uint in_ESI;
  ImGuiID in_EDI;
  int n;
  ImGuiContext *g;
  bool local_1d;
  int local_1c;
  bool local_1;
  
  pIVar1 = GImGui;
  if ((in_ESI & 0x80) == 0) {
    if ((in_ESI & 0x100) == 0) {
      local_1d = false;
      if ((GImGui->BeginPopupStack).Size < (GImGui->OpenPopupStack).Size) {
        pIVar2 = ImVector<ImGuiPopupData>::operator[]
                           (&GImGui->OpenPopupStack,(GImGui->BeginPopupStack).Size);
        local_1d = pIVar2->PopupId == in_EDI;
      }
      local_1 = local_1d;
    }
    else {
      for (local_1c = 0; local_1c < (pIVar1->OpenPopupStack).Size; local_1c = local_1c + 1) {
        pIVar2 = ImVector<ImGuiPopupData>::operator[](&pIVar1->OpenPopupStack,local_1c);
        if (pIVar2->PopupId == in_EDI) {
          return true;
        }
      }
      local_1 = false;
    }
  }
  else if ((in_ESI & 0x100) == 0) {
    local_1 = (GImGui->BeginPopupStack).Size < (GImGui->OpenPopupStack).Size;
  }
  else {
    local_1 = 0 < (GImGui->OpenPopupStack).Size;
  }
  return local_1;
}

Assistant:

bool ImGui::IsPopupOpen(ImGuiID id, ImGuiPopupFlags popup_flags)
{
    ImGuiContext& g = *GImGui;
    if (popup_flags & ImGuiPopupFlags_AnyPopupId)
    {
        // Return true if any popup is open at the current BeginPopup() level of the popup stack
        // This may be used to e.g. test for another popups already opened to handle popups priorities at the same level.
        IM_ASSERT(id == 0);
        if (popup_flags & ImGuiPopupFlags_AnyPopupLevel)
            return g.OpenPopupStack.Size > 0;
        else
            return g.OpenPopupStack.Size > g.BeginPopupStack.Size;
    }
    else
    {
        if (popup_flags & ImGuiPopupFlags_AnyPopupLevel)
        {
            // Return true if the popup is open anywhere in the popup stack
            for (int n = 0; n < g.OpenPopupStack.Size; n++)
                if (g.OpenPopupStack[n].PopupId == id)
                    return true;
            return false;
        }
        else
        {
            // Return true if the popup is open at the current BeginPopup() level of the popup stack (this is the most-common query)
            return g.OpenPopupStack.Size > g.BeginPopupStack.Size && g.OpenPopupStack[g.BeginPopupStack.Size].PopupId == id;
        }
    }
}